

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int fs_storage_path(char *appname,char *path,int max)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  int buffer_size;
  int iVar4;
  char *__s;
  char *__s_00;
  size_t sVar5;
  __int32_t **pp_Var6;
  char *pcVar7;
  int iVar8;
  char *buffer;
  long in_FS_OFFSET;
  undefined8 uStack_60;
  char local_58 [8];
  char *local_50;
  char *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_60 = 0x13dc94;
  local_48 = appname;
  __s = getenv("HOME");
  uStack_60 = 0x13dca3;
  __s_00 = getenv("XDG_DATA_HOME");
  pcVar3 = local_48;
  lVar2 = -((ulong)(uint)max + 0xf & 0xfffffffffffffff0);
  buffer = local_58 + lVar2;
  for (pcVar7 = local_58; (long)buffer < (long)pcVar7; pcVar7 = pcVar7 + -0x1000) {
    *(undefined8 *)pcVar7 = *(undefined8 *)pcVar7;
  }
  if (__s == (char *)0x0) {
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0xffffffffffffffff;
    iVar8 = (int)*(undefined8 *)((long)&uStack_60 + lVar2);
  }
  else {
    local_3c = max;
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13dcf2;
    str_format(path,max,"%s/.%s",__s,pcVar3);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13dcfa;
    sVar5 = strlen(__s);
    local_50 = path;
    for (pcVar7 = path + ((int)sVar5 + 2); buffer_size = local_3c, pcVar3 = local_48,
        cVar1 = *pcVar7, (long)cVar1 != 0; pcVar7 = pcVar7 + 1) {
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13dd15;
      pp_Var6 = __ctype_tolower_loc();
      *pcVar7 = (char)(*pp_Var6)[cVar1];
    }
    if (__s_00 == (char *)0x0) {
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13dd99;
      str_format(buffer,buffer_size,"%s/.local/share/%s",__s,pcVar3);
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13dda1;
      sVar5 = strlen(__s);
      for (pcVar7 = buffer + ((int)sVar5 + 0xe); cVar1 = *pcVar7, (long)cVar1 != 0;
          pcVar7 = pcVar7 + 1) {
        *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13ddba;
        pp_Var6 = __ctype_tolower_loc();
        *pcVar7 = (char)(*pp_Var6)[cVar1];
      }
    }
    else {
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13dd47;
      str_format(buffer,buffer_size,"%s/%s",__s_00,pcVar3);
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13dd4f;
      sVar5 = strlen(__s_00);
      pcVar7 = buffer + (int)sVar5;
      while( true ) {
        pcVar7 = pcVar7 + 1;
        cVar1 = *pcVar7;
        if ((long)cVar1 == 0) break;
        *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13dd66;
        pp_Var6 = __ctype_tolower_loc();
        *pcVar7 = (char)(*pp_Var6)[cVar1];
      }
    }
    pcVar7 = local_50;
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13ddd4;
    iVar4 = fs_is_dir(pcVar7);
    iVar8 = 0;
    if (iVar4 == 0) {
      iVar8 = 0;
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13ddf5;
      str_format(pcVar7,buffer_size,"%s",buffer);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  *(code **)((long)&uStack_60 + lVar2) = fs_makedir;
  __stack_chk_fail();
}

Assistant:

int fs_storage_path(const char *appname, char *path, int max)
{
#if defined(CONF_FAMILY_WINDOWS)
	WCHAR *home = _wgetenv(L"APPDATA");
	char buffer[IO_MAX_PATH_LENGTH];
	if(!home)
		return -1;
	WideCharToMultiByte(CP_UTF8, 0, home, -1, buffer, sizeof(buffer), NULL, NULL);
	str_format(path, max, "%s/%s", buffer, appname);
	return 0;
#else
	char *home = getenv("HOME");
	int i;
	char *xdgdatahome = getenv("XDG_DATA_HOME");
	char xdgpath[max];

	if(!home)
		return -1;

#if defined(CONF_PLATFORM_MACOSX)
	str_format(path, max, "%s/Library/Application Support/%s", home, appname);
	return 0;
#endif

	/* old folder location */
	str_format(path, max, "%s/.%s", home, appname);
	for(i = str_length(home)+2; path[i]; i++)
		path[i] = tolower(path[i]);

	if(!xdgdatahome)
	{
		/* use default location */
		str_format(xdgpath, max, "%s/.local/share/%s", home, appname);
		for(i = str_length(home)+14; xdgpath[i]; i++)
			xdgpath[i] = tolower(xdgpath[i]);
	}
	else
	{
		str_format(xdgpath, max, "%s/%s", xdgdatahome, appname);
		for(i = str_length(xdgdatahome)+1; xdgpath[i]; i++)
			xdgpath[i] = tolower(xdgpath[i]);
	}

	/* check for old location / backward compatibility */
	if(fs_is_dir(path))
	{
		/* use old folder path */
		/* for backward compatibility */
		return 0;
	}

	str_format(path, max, "%s", xdgpath);

	return 0;
#endif
}